

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::FinalizeTargetConfiguration
          (cmTarget *this,cmBTStringRange *noConfigCompileDefinitions,
          optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
          *perConfigCompileDefinitions)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar2;
  cmMakefile *this_00;
  bool bVar3;
  PolicyStatus PVar4;
  cmake *pcVar5;
  _Rb_tree_node_base *p_Var6;
  cmValue value;
  mapped_type *pmVar7;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *def;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  pointer s;
  string defPropName;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->TargetType != 6) {
    pcVar5 = cmMakefile::GetCMakeInstance((_Var1._M_head_impl)->Makefile);
    bVar3 = anon_unknown.dwarf_b1c44d::CheckLinkLibraryPattern
                      (&(_Var1._M_head_impl)->LinkLibraries,pcVar5);
    if (bVar3) {
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      pcVar5 = cmMakefile::GetCMakeInstance((_Var1._M_head_impl)->Makefile);
      bVar3 = anon_unknown.dwarf_b1c44d::CheckLinkLibraryPattern
                        (&(_Var1._M_head_impl)->InterfaceLinkLibraries,pcVar5);
      if (bVar3) {
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        pcVar5 = cmMakefile::GetCMakeInstance((_Var1._M_head_impl)->Makefile);
        bVar3 = anon_unknown.dwarf_b1c44d::CheckLinkLibraryPattern
                          (&(_Var1._M_head_impl)->InterfaceLinkLibrariesDirect,pcVar5);
        if (bVar3) {
          AppendBuildInterfaceIncludes(this);
          if (((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 7) {
            pBVar2 = (noConfigCompileDefinitions->End)._M_current;
            for (entry = (noConfigCompileDefinitions->Begin)._M_current; entry != pBVar2;
                entry = entry + 1) {
              InsertCompileDefinition(this,entry);
            }
            this_00 = ((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
            PVar4 = cmMakefile::GetPolicyStatus(this_00,CMP0043,false);
            if (PVar4 < NEW) {
              if ((perConfigCompileDefinitions->
                  super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                  ._M_engaged == true) {
                for (p_Var6 = *(_Rb_tree_node_base **)
                               ((long)&(perConfigCompileDefinitions->
                                       super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
                                       )._M_payload.
                                       super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                                       ._M_payload + 0x18);
                    p_Var6 != (_Rb_tree_node_base *)
                              ((long)&(perConfigCompileDefinitions->
                                      super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                                      ._M_payload + 8);
                    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                  if (*(string **)(p_Var6 + 2) != (string *)0x0) {
                    defPropName.field_2._M_local_buf[0] = '\0';
                    AppendProperty(this,(string *)(p_Var6 + 1),*(string **)(p_Var6 + 2),
                                   (optional<cmListFileBacktrace> *)&defPropName,false);
                    std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
                              ((_Optional_payload_base<cmListFileBacktrace> *)&defPropName);
                  }
                }
              }
              else {
                std::
                optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
                ::emplace<>(perConfigCompileDefinitions);
                cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,this_00,ExcludeEmptyConfig);
                for (s = configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    s != configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
                  cmsys::SystemTools::UpperCase(&local_68,s);
                  cmStrCat<char_const(&)[21],std::__cxx11::string>
                            (&defPropName,(char (*) [21])"COMPILE_DEFINITIONS_",&local_68);
                  std::__cxx11::string::~string((string *)&local_68);
                  value = cmMakefile::GetProperty(this_00,&defPropName);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                                         *)perConfigCompileDefinitions,&defPropName);
                  pmVar7->Value = value.Value;
                  if (value.Value != (string *)0x0) {
                    local_68.field_2._M_local_buf[0] = '\0';
                    AppendProperty(this,&defPropName,value.Value,
                                   (optional<cmListFileBacktrace> *)&local_68,false);
                    std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
                              ((_Optional_payload_base<cmListFileBacktrace> *)&local_68);
                  }
                  std::__cxx11::string::~string((string *)&defPropName);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&configs);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

FileSetEntries(cm::static_string_view propertyName)
    : PropertyName(propertyName)
  {
  }